

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildFunction(ObjectModelBuilder *this,string *functionString,Class *clazz)

{
  ostream *poVar1;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  string function;
  
  string_trim((string *)local_48,functionString);
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_70 = (undefined1  [8])clazz;
  local_68._M_p = (pointer)&local_58;
  std::__cxx11::string::_M_assign((string *)&local_68);
  std::vector<Function,_std::allocator<Function>_>::push_back
            (&clazz->functions,(value_type *)local_70);
  if (this->m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," - function: \'",0xe);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_48,(long)function._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p);
  }
  if (local_48 != (undefined1  [8])&function._M_string_length) {
    operator_delete((void *)local_48);
  }
  return true;
}

Assistant:

bool ObjectModelBuilder::buildFunction(const std::string &functionString, Class *clazz)
{
    std::string function = string_trim(functionString);

    Function f;
    f.clazz = clazz;
    f.signature = function;
    clazz->functions.push_back(f);

    if (m_verbose)
        std::cerr << " - function: '" << function << "'" << std::endl;

    return true;
}